

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O1

bool __thiscall
sptk::reaper::EpochTracker::Init
          (EpochTracker *this,int16_t *input,int32_t n_input,float sample_rate,float min_f0_search,
          float max_f0_search,bool do_highpass,bool do_hilbert_transform)

{
  pointer pfVar1;
  int16_t *input_00;
  ulong uVar2;
  EpochTracker *pEVar3;
  bool bVar4;
  vector<float,_std::allocator<float>_> *this_00;
  
  bVar4 = false;
  if ((((input != (int16_t *)0x0) && (bVar4 = false, 6000.0 < sample_rate)) &&
      (bVar4 = false, 0.0 < min_f0_search)) &&
     ((sample_rate * 0.05 < (float)n_input && (min_f0_search < max_f0_search)))) {
    pEVar3 = this;
    CleanUp(this);
    this->min_f0_search_ = min_f0_search;
    this->max_f0_search_ = max_f0_search;
    this->sample_rate_ = sample_rate;
    input_00 = input;
    if (do_highpass) {
      input_00 = HighpassFilter(pEVar3,input,n_input,sample_rate,this->corner_frequency_,
                                this->filter_duration_);
    }
    this_00 = &this->signal_;
    pEVar3 = (EpochTracker *)this_00;
    std::vector<float,_std::allocator<float>_>::resize(this_00,(long)n_input);
    if (do_hilbert_transform) {
      HilbertTransform(pEVar3,input_00,n_input,
                       (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_start);
    }
    else if (0 < n_input) {
      pfVar1 = (this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = 0;
      do {
        pfVar1[uVar2] = (float)(int)input_00[uVar2];
        uVar2 = uVar2 + 1;
      } while ((uint)n_input != uVar2);
    }
    bVar4 = true;
    if (input_00 != input) {
      operator_delete__(input_00);
    }
  }
  return bVar4;
}

Assistant:

bool EpochTracker::Init(const int16_t* input, int32_t n_input, float sample_rate,
                        float min_f0_search, float max_f0_search,
                        bool do_highpass, bool do_hilbert_transform) {
#if 0
  if (input && (sample_rate > 6000.0) && (n_input > (sample_rate * 0.05)) &&
#else
  if (input && (sample_rate > kMinSampleRate) && (n_input > (sample_rate * 0.05)) &&
#endif
      (min_f0_search < max_f0_search) && (min_f0_search > 0.0)) {
    CleanUp();
    min_f0_search_ = min_f0_search;
    max_f0_search_ = max_f0_search;
    sample_rate_ = sample_rate;
    int16_t* input_p = const_cast<int16_t *>(input);
    if (do_highpass) {
      input_p = HighpassFilter(input_p, n_input, sample_rate,
                               corner_frequency_, filter_duration_);
    }
    signal_.resize(n_input);
    if (do_hilbert_transform) {
      HilbertTransform(input_p, n_input, &(signal_.front()));
    } else {
      for (int32_t i = 0; i < n_input; ++i) {
        signal_[i] = input_p[i];
      }
    }
    if (input_p != input) {
      delete [] input_p;
    }
    return true;
  }